

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,char value)

{
  undefined7 in_register_00000011;
  allocator local_2d;
  char local_2c;
  char cStack_2b;
  undefined2 uStack_2a;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  char chstr [4];
  allocator local_12;
  char local_11;
  string *psStack_10;
  char value_local;
  
  local_11 = (char)this;
  psStack_10 = __return_storage_ptr__;
  if (local_11 == '\r') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\'\\r\'",&local_12);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
  }
  else if (local_11 == '\f') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\'\\f\'",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  else if (local_11 == '\n') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\'\\n\'",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (local_11 == '\t') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\'\\t\'",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if ((local_11 < '\0') || ('\x1f' < local_11)) {
    _local_2c = CONCAT22(0x27,CONCAT11(local_11,0x27));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,&local_2c,&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  }
  else {
    toString_abi_cxx11_(__return_storage_ptr__,(Catch *)(ulong)(uint)(int)local_11,
                        (uint)CONCAT71(in_register_00000011,value));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString( char value ) {
    if ( value == '\r' )
        return "'\\r'";
    if ( value == '\f' )
        return "'\\f'";
    if ( value == '\n' )
        return "'\\n'";
    if ( value == '\t' )
        return "'\\t'";
    if ( '\0' <= value && value < ' ' )
        return toString( static_cast<unsigned int>( value ) );
    char chstr[] = "' '";
    chstr[1] = value;
    return chstr;
}